

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::ContainerEqMatcher<std::array<solitaire::cards::Card,52ul>>::
MatchAndExplain<std::array<solitaire::cards::Card,52ul>>
          (ContainerEqMatcher<std::array<solitaire::cards::Card,52ul>> *this,
          array<solitaire::cards::Card,_52UL> *lhs,MatchResultListener *listener)

{
  ostream *os;
  bool bVar1;
  Card *pCVar2;
  Card *pCVar3;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  long lVar8;
  
  bVar1 = std::operator==(lhs,(array<solitaire::cards::Card,_52UL> *)this);
  if ((!bVar1) && (os = listener->stream_, os != (ostream *)0x0)) {
    bVar7 = false;
    for (lVar8 = 0; lVar8 != 0x1a0; lVar8 = lVar8 + 8) {
      pCVar3 = (Card *)((long)&lhs->_M_elems[0].value + lVar8);
      pCVar2 = ArrayAwareFind<solitaire::cards::Card_const*,solitaire::cards::Card>
                         ((Card *)this,(Card *)(this + 0x1a0),pCVar3);
      if (pCVar2 == (Card *)(this + 0x1a0)) {
        pcVar5 = "which has these unexpected elements: ";
        if (bVar7) {
          pcVar5 = ", ";
        }
        else {
          bVar7 = true;
        }
        std::operator<<(os,pcVar5);
        solitaire::cards::operator<<(os,pCVar3);
      }
    }
    pcVar5 = "which";
    if (bVar7) {
      pcVar5 = ",\nand";
    }
    bVar7 = false;
    for (lVar8 = 0; lVar8 != 0x1a0; lVar8 = lVar8 + 8) {
      pCVar3 = ArrayAwareFind<solitaire::cards::Card_const*,solitaire::cards::Card>
                         (lhs->_M_elems,lhs[1]._M_elems,(Card *)(this + lVar8));
      if (pCVar3 == lhs[1]._M_elems) {
        if (bVar7) {
          pcVar6 = ", ";
          poVar4 = os;
        }
        else {
          poVar4 = std::operator<<(os,pcVar5);
          pcVar6 = " doesn\'t have these expected elements: ";
        }
        std::operator<<(poVar4,pcVar6);
        solitaire::cards::operator<<(os,(Card *)(this + lVar8));
        bVar7 = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }